

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

void __thiscall gl4cts::CopyImage::SamplesMissMatchTest::clean(SamplesMissMatchTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(1,&this->m_dst_tex_name);
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(1,&this->m_src_tex_name);
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  return;
}

Assistant:

void SamplesMissMatchTest::clean()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	/* Clean textures . Errors ignored */
	gl.deleteTextures(1, &m_dst_tex_name);
	gl.deleteTextures(1, &m_src_tex_name);

	m_dst_tex_name = 0;
	m_src_tex_name = 0;
}